

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O3

expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunk(expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
               idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  allocator *paVar1;
  int iVar2;
  __off_t _Var3;
  __off_t _Var4;
  ulong uVar5;
  FILE *pFVar6;
  byte bVar7;
  unsigned_long *Key;
  uint uVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  char cVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  undefined8 uVar14;
  long lVar15;
  undefined4 uVar16;
  ulong *puVar17;
  size_t sVar18;
  ulong uVar19;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar20;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int NChunks;
  u64 ChunkAddress;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddr;
  int S;
  file_cache FileCache;
  timer IOTimer_1;
  chunk_cache ChunkCache;
  int local_2a4;
  int local_2a0;
  uint local_29c;
  FILE *local_298;
  undefined4 local_290;
  uint local_28c;
  hash_table<unsigned_long,_idx2::chunk_cache> local_288;
  timespec local_258;
  buffer local_248;
  anon_union_8_2_2df48d06_for_stref_0 local_230 [2];
  undefined1 local_220 [16];
  bucket_status *local_210;
  long local_208;
  long local_200;
  buffer local_1f8;
  u64 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [48];
  hash_table<unsigned_long,_idx2::chunk_cache> local_198 [3];
  iterator local_f0;
  chunk_cache local_d0;
  
  local_28c = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_290 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_288.LogCapacity = (i64)Idx2;
  local_1e0 = Brick;
  ConstructFilePath((file_id *)local_230,Idx2,Brick,(i8)Key,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_220 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_220,Key);
  clock_gettime(1,&local_258);
  local_288.Alloc = (allocator *)D;
  if ((*(char *)(*(long *)(local_208 + 0x10) + local_200) == '\x02') &&
     (local_210[0xc9] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x60;
    pcVar11 = "";
    uVar16 = 0;
  }
  else {
    pFVar6 = fopen(local_230[0].Ptr,"rb");
    if (pFVar6 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 99;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '%') {
          cVar12 = '%';
          goto LAB_00193614;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar12 = '\'';
LAB_00193614:
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == cVar12) {
          lVar15 = *in_FS_OFFSET;
          iVar2 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                           (ulong)*(uint *)(&action_s::NameMap + lVar9),
                           *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                           ,99);
          pcVar11 = "File: %s";
          snprintf((char *)(lVar15 + -0xf80) + iVar2,0x400 - (long)iVar2,"File: %s",local_230[0].Ptr
                  );
          uVar16 = 0x10025;
          goto LAB_001936ad;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      goto LAB_001938e0;
    }
    fseeko(pFVar6,0,2);
    _Var3 = ftello(pFVar6);
    local_1d8._12_4_ = 0;
    _Var4 = ftello(pFVar6);
    fseeko(pFVar6,_Var4 + -4,0);
    fread(local_1d8 + 0xc,4,1,pFVar6);
    fseeko(pFVar6,_Var4 + -4,0);
    fseeko(pFVar6,_Var3 - (int)local_1d8._12_4_,0);
    local_29c = 0;
    _Var3 = ftello(pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    fread(&local_29c,4,1,pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    _Var3 = ftello(pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    fread(&local_2a0,4,1,pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    local_288.Keys = (unsigned_long *)0x0;
    local_288.Vals = (chunk_cache *)0x0;
    local_288.Stats = (bucket_status *)&Mallocator()::Instance;
    lVar9 = (long)local_2a0;
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    AllocBuf((buffer *)&local_288,lVar9,(allocator *)&Mallocator()::Instance);
    paVar1 = local_288.Alloc;
    sVar18 = (size_t)local_2a0;
    if ((long)local_288.Vals < (long)sVar18) {
LAB_00193be6:
      __assert_fail("Sz <= Size(*Buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                    ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
    }
    _Var3 = ftello(pFVar6);
    fseeko(pFVar6,_Var3 - sVar18,0);
    fread(local_288.Keys,sVar18,1,pFVar6);
    fseeko(pFVar6,_Var3 - sVar18,0);
    LOCK();
    (((atomic<unsigned_long> *)((long)paVar1 + 0x260))->super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)((long)paVar1 + 0x260))->super___atomic_base<unsigned_long>).
         _M_i + sVar18;
    UNLOCK();
    clock_gettime(1,(timespec *)(local_1d8 + 0x10));
    LOCK();
    (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->super___atomic_base<unsigned_long>).
         _M_i + (long)((double)(local_1c8._0_8_ - local_258.tv_sec) * 1000000000.0 +
                      (double)(local_1c8._8_8_ - local_258.tv_nsec));
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    local_1f8.Data = (byte *)0x0;
    local_1f8.Bytes = 0;
    local_1f8.Alloc = (allocator *)&Mallocator()::Instance;
    lVar9 = (long)(int)local_29c;
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    AllocBuf(&local_1f8,lVar9 << 3,(allocator *)&Mallocator()::Instance);
    DecompressBufZstd((buffer *)&local_288,&local_1f8);
    clock_gettime(1,(timespec *)(local_1d8 + 0x10));
    clock_gettime(1,&local_258);
    local_2a4 = 0;
    _Var3 = ftello(pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    fread(&local_2a4,4,1,pFVar6);
    fseeko(pFVar6,_Var3 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    local_248.Data = (byte *)0x0;
    local_248.Bytes = 0;
    local_248.Alloc = (allocator *)&Mallocator()::Instance;
    lVar9 = (long)local_2a4;
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    AllocBuf(&local_248,lVar9,(allocator *)&Mallocator()::Instance);
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    sVar18 = (size_t)local_2a4;
    if (local_248.Bytes < (long)sVar18) goto LAB_00193be6;
    _Var3 = ftello(pFVar6);
    fseeko(pFVar6,_Var3 - sVar18,0);
    fread(local_248.Data,sVar18,1,pFVar6);
    fseeko(pFVar6,_Var3 - sVar18,0);
    LOCK();
    (((atomic<unsigned_long> *)((long)paVar1 + 0x260))->super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)((long)paVar1 + 0x260))->super___atomic_base<unsigned_long>).
         _M_i + sVar18;
    UNLOCK();
    clock_gettime(1,(timespec *)(local_1d8 + 0x10));
    puVar17 = (ulong *)local_248.Data;
    LOCK();
    (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->super___atomic_base<unsigned_long>).
         _M_i + (long)((double)(local_1c8._0_8_ - local_258.tv_sec) * 1000000000.0 +
                      (double)(local_1c8._8_8_ - local_258.tv_nsec));
    UNLOCK();
    uVar5 = *(ulong *)local_248.Data;
    file_cache::file_cache((file_cache *)(local_1d8 + 0x10));
    if (Mallocator()::Instance == '\0') {
      ReadChunk();
    }
    Init<unsigned_long,idx2::chunk_cache>
              ((hash_table<unsigned_long,_idx2::chunk_cache> *)(local_1c8 + 0x30),10,
               (allocator *)&Mallocator()::Instance);
    local_298 = (FILE *)(ulong)local_29c;
    local_288.Size = (i64)__return_storage_ptr__;
    if (local_298 != (FILE *)0x0) {
      uVar19 = 0;
      uVar14 = Empty;
      uVar10 = 0;
      do {
        bVar7 = 0;
        lVar9 = 0;
        do {
          if (0x39 < (int)uVar10) {
            uVar5 = *(ulong *)((long)puVar17 + (ulong)(uVar10 >> 3));
            puVar17 = (ulong *)((long)puVar17 + (ulong)(uVar10 >> 3));
            uVar10 = uVar10 & 7;
          }
          uVar13 = uVar5 >> ((byte)uVar10 & 0x3f);
          uVar8 = uVar10 + 7;
          if (0x38 < (int)uVar10) {
            uVar5 = *(ulong *)((long)puVar17 + (ulong)(uVar8 >> 3));
            puVar17 = (ulong *)((long)puVar17 + (ulong)(uVar8 >> 3));
            uVar8 = 0;
          }
          lVar9 = lVar9 + ((uVar13 & bitstream::Masks.Arr[7]) << (bVar7 & 0x3f));
          Val = (chunk_cache *)(uVar5 >> ((byte)uVar8 & 0x3f));
          uVar10 = uVar8 + 1;
          bVar7 = bVar7 + 7;
        } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
        local_1d8._0_8_ = ((allocator *)((long)local_1f8.Data + uVar19 * 8))->_vptr_allocator;
        chunk_cache::chunk_cache(&local_d0);
        local_d0.ChunkPos = (i32)uVar19;
        Insert<unsigned_long,idx2::chunk_cache>
                  (&local_f0,(idx2 *)(local_1c8 + 0x30),
                   (hash_table<unsigned_long,_idx2::chunk_cache> *)local_1d8,
                   (unsigned_long *)&local_d0,Val);
        if ((long)local_1c8._32_8_ <= (long)local_1c8._24_8_) {
          GrowCapacity<long>((array<long> *)(local_1d8 + 0x10),0);
        }
        uVar14 = uVar14 + lVar9;
        paVar1 = (allocator *)((long)&((allocator *)local_1c8._24_8_)->_vptr_allocator + Tombstone);
        *(undefined8 *)(local_1c8._0_8_ + local_1c8._24_8_ * 8) = uVar14;
        uVar19 = uVar19 + 1;
        local_1c8._24_8_ = paVar1;
      } while ((FILE *)uVar19 != local_298);
    }
    if (*(char *)(*(long *)(local_208 + 0x10) + local_200) == '\x02') {
      *(bucket_status **)(local_210 + 0x40) = local_198[0].Stats;
      *(i64 *)(local_210 + 0x48) = local_198[0].Size;
      *(i64 *)(local_210 + 0x50) = local_198[0].LogCapacity;
      *(allocator **)(local_210 + 0x58) = local_198[0].Alloc;
      *(unsigned_long **)(local_210 + 0x30) = local_198[0].Keys;
      *(chunk_cache **)(local_210 + 0x38) = local_198[0].Vals;
      *(bucket_status **)(local_210 + 0x40) = local_198[0].Stats;
      *(i64 *)(local_210 + 0x48) = local_198[0].Size;
      *(undefined8 *)local_210 = local_1c8._0_8_;
      *(undefined8 *)(local_210 + 8) = local_1c8._8_8_;
      *(undefined8 *)(local_210 + 0x10) = local_1c8._16_8_;
      *(undefined8 *)(local_210 + 0x18) = local_1c8._24_8_;
      *(undefined8 *)(local_210 + 0x10) = local_1c8._16_8_;
      *(undefined8 *)(local_210 + 0x18) = local_1c8._24_8_;
      *(undefined8 *)(local_210 + 0x20) = local_1c8._32_8_;
      *(ulong *)(local_210 + 0x28) = CONCAT44(local_1c8._44_4_,local_1c8._40_4_);
    }
    else {
      Insert<unsigned_long,idx2::file_cache>
                ((iterator *)(local_220 + 8),(unsigned_long *)local_220,
                 (file_cache *)(local_1d8 + 0x10));
    }
    __return_storage_ptr__ =
         (expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *)local_288.Size;
    local_210[0xc9] = Tombstone;
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9e;
    DeallocBuf(&local_248);
    DeallocBuf(&local_1f8);
    DeallocBuf((buffer *)&local_288);
    pcVar11 = "";
    uVar16 = 0;
LAB_001936ad:
    if (pFVar6 != (FILE *)0x0) {
      fclose(pFVar6);
    }
  }
  if ((char)uVar16 == '\0') {
    if (*(char *)(*(long *)(local_208 + 0x10) + local_200) != '\x02') {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xbe;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '%') {
          cVar12 = '%';
          goto LAB_001938c9;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar12 = '\'';
LAB_001938c9:
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == cVar12) {
          lVar15 = *in_FS_OFFSET;
          iVar2 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                           (ulong)*(uint *)(&action_s::NameMap + lVar9),
                           *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                           ,0xbe);
          snprintf((char *)(lVar15 + -0xf80) + iVar2,0x400 - (long)iVar2,"File: %s\n",
                   local_230[0].Ptr);
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0b78;
          (__return_storage_ptr__->field_1).Val = (chunk_cache *)"File: %s\n";
          (__return_storage_ptr__->field_1).Err.StrGened = true;
          *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
          goto LAB_00193990;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
LAB_001938e0:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                    ,0x38,"stref idx2::ToString(idx2_err_code)");
    }
    cVar12 = (char)local_28c;
    if ('\x0f' < cVar12) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar5 = (ulong)((stack_array<int,_16> *)(local_288.LogCapacity + 0xa00))->Arr[cVar12];
    lVar9 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    bVar7 = -(uVar5 == 0) | (byte)lVar9;
    local_288.Keys =
         (unsigned_long *)
         (((ulong)((ushort)BpKey & 0xfff) |
          (long)((int)(char)local_290 << 0xc) + ((ulong)(local_28c & 0xff) << 0x3c)) +
         (local_1e0 >> ((1L << (bVar7 & 0x3f) != uVar5) + bVar7 & 0x3f)) * 0x40000);
    Lookup<unsigned_long,idx2::chunk_cache>
              ((iterator *)(local_1d8 + 0x10),(idx2 *)(local_210 + 0x30),&local_288,local_288.Keys);
    uVar14 = local_1c8._8_8_;
    if (*(char *)((long)(_func_int ***)local_1c8._24_8_ + *(long *)(local_1c8._16_8_ + 0x10)) ==
        '\x02') {
      if ((((bitstream *)(local_1c8._8_8_ + 0x68))->Stream).Bytes == 0) {
        clock_gettime(1,(timespec *)&local_f0);
        pFVar6 = fopen(local_230[0].Ptr,"rb");
        if (pFVar6 == (FILE *)0x0) {
          local_1c8._0_8_ = local_230;
          eVar20 = ReadChunk::anon_class_8_1_1e916d15::operator()
                             ((anon_class_8_1_1e916d15 *)(local_1d8 + 0x10));
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0b78;
          (__return_storage_ptr__->field_1).Val = (chunk_cache *)eVar20.Msg;
          *(short *)((long)&__return_storage_ptr__->field_1 + 8) = eVar20._8_2_;
          (__return_storage_ptr__->field_1).Err.StrGened = eVar20.StrGened;
          __return_storage_ptr__->Ok = false;
          return __return_storage_ptr__;
        }
        lVar9 = (long)*(i32 *)local_1c8._8_8_;
        if (lVar9 < 1) {
          lVar15 = 0;
        }
        else {
          lVar15 = *(long *)((*(undefined8 *)local_210 - 8) + lVar9 * 8);
        }
        lVar9 = *(long *)(*(undefined8 *)local_210 + lVar9 * 8);
        fseeko(pFVar6,lVar15,0);
        if (Mallocator()::Instance == '\0') {
          ReadChunk();
        }
        local_1c8._0_8_ = (allocator *)0x0;
        local_1c8._8_8_ = 0;
        local_1c8._16_8_ = &Mallocator()::Instance;
        local_1c8._24_8_ = (allocator *)0x0;
        local_1c8._32_8_ = 0;
        local_1c8._40_4_ = 0;
        if (Mallocator()::Instance == '\0') {
          ReadChunk();
        }
        (*(code *)*Mallocator()::Instance)
                  (&Mallocator()::Instance,local_1d8 + 0x10,(lVar9 - lVar15) + 8);
        local_1c8._24_8_ = local_1c8._0_8_;
        local_1c8._40_4_ = 0;
        local_1c8._32_8_ = 0;
        fread((void *)local_1c8._0_8_,local_1c8._8_8_,1,pFVar6);
        paVar1 = local_288.Alloc;
        LOCK();
        (((atomic<unsigned_long> *)((long)local_288.Alloc + 0x260))->
        super___atomic_base<unsigned_long>)._M_i =
             local_1c8._8_8_ +
             (((atomic<unsigned_long> *)((long)local_288.Alloc + 0x260))->
             super___atomic_base<unsigned_long>)._M_i;
        UNLOCK();
        local_298 = pFVar6;
        clock_gettime(1,(timespec *)&local_d0);
        pFVar6 = local_298;
        LOCK();
        (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->super___atomic_base<unsigned_long>)._M_i
             = (((atomic<unsigned_long> *)((long)paVar1 + 0x250))->
               super___atomic_base<unsigned_long>)._M_i +
               (long)((double)(CONCAT44(local_d0._4_4_,local_d0.ChunkPos) - (long)local_f0.Key) *
                      1000000000.0 +
                     (double)((long)local_d0.Bricks.Buffer.Data - (long)local_f0.Val));
        UNLOCK();
        uVar5 = (ulong)((stack_array<int,_16> *)(local_288.LogCapacity + 0xa00))->Arr[cVar12];
        lVar9 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        bVar7 = -(uVar5 == 0) | (byte)lVar9;
        DecompressChunk((bitstream *)(local_1d8 + 0x10),(chunk_cache *)uVar14,(u64)local_288.Keys,
                        (int)(char)((1L << (bVar7 & 0x3f) != uVar5) + bVar7));
        fclose(pFVar6);
      }
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0b78;
      (__return_storage_ptr__->field_1).Val = (chunk_cache *)uVar14;
      __return_storage_ptr__->Ok = true;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 199;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0b78;
      (__return_storage_ptr__->field_1).Val = (chunk_cache *)0x1bd78d;
      (__return_storage_ptr__->field_1).Err.StrGened = false;
      *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
      __return_storage_ptr__->Ok = false;
    }
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0xbc;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0b78;
    (__return_storage_ptr__->field_1).Val = (chunk_cache *)pcVar11;
    (__return_storage_ptr__->field_1).Err.StrGened = SUB41((uint)uVar16 >> 0x10,0);
    *(ushort *)((long)&__return_storage_ptr__->field_1 + 8) = (ushort)uVar16 | 0x100;
LAB_00193990:
    __return_storage_ptr__->Ok = false;
  }
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_cache*, idx2_err_code>
ReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return ChunkCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFile(Idx2, D, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  //printf("chunk %llu\n", ChunkAddress);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return ChunkCacheIt.Val;
}